

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

STObject * __thiscall jbcoin::STObject::operator=(STObject *this,STObject *other)

{
  (this->super_STBase).fName = (other->super_STBase).fName;
  this->mType = other->mType;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::_M_move_assign
            (&this->v_,&other->v_);
  return this;
}

Assistant:

STObject&
STObject::operator= (STObject&& other)
{
    setFName(other.getFName());
    mType = other.mType;
    v_ = std::move(other.v_);
    return *this;
}